

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readObject(Reader *this,Token *tokenStart)

{
  TokenType TVar1;
  bool bVar2;
  char *__s;
  _Elt_pointer ppVVar3;
  Value numberName;
  string name;
  Token colon;
  Token comma;
  Token tokenName;
  Value init;
  ValueHolder local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_c8;
  Token local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)tokenStart->start_ - (long)this->begin_);
  do {
    readToken(this,&local_70);
    while (TVar1 = local_70.type_, local_70.type_ == tokenComment) {
      readToken(this,&local_70);
    }
    if (local_70.type_ == tokenObjectEnd) {
      if (local_c8._M_string_length != 0) {
        *local_c8._M_dataplus._M_p = '\0';
LAB_00481605:
        local_c8._M_string_length = 0;
        local_f0[0].string_ = (char *)&local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"Missing \'}\' or object member name","");
        addError(this,(string *)local_f0,&local_70,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
LAB_0048164a:
        if (local_f0[0] != &local_e0) {
          operator_delete(local_f0[0].string_,local_e0._M_allocated_capacity + 1);
        }
LAB_00481661:
        bVar2 = false;
        goto LAB_00481667;
      }
      break;
    }
    local_c8._M_string_length = 0;
    *local_c8._M_dataplus._M_p = '\0';
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ == true) {
        Value::Value((Value *)local_f0,nullValue);
        bVar2 = decodeNumber(this,&local_70,(Value *)local_f0);
        if (bVar2) {
          __s = Value::asCString((Value *)local_f0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,__s,(allocator<char> *)&local_88);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if ((Location *)CONCAT44(local_a8._4_4_,local_a8.type_) != &local_a8.end_) {
            operator_delete((undefined1 *)CONCAT44(local_a8._4_4_,local_a8.type_),
                            (ulong)(local_a8.end_ + 1));
          }
          Value::~Value((Value *)local_f0);
          goto LAB_0048153b;
        }
        recoverFromError(this,tokenObjectEnd);
        Value::~Value((Value *)local_f0);
        goto LAB_00481661;
      }
      goto LAB_00481605;
    }
    if (TVar1 != tokenString) goto LAB_00481605;
    bVar2 = decodeString(this,&local_70,&local_c8);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_00481661;
    }
LAB_0048153b:
    readToken(this,&local_a8);
    if (local_a8.type_ != tokenMemberSeparator) {
      local_f0[0].string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Missing \':\' after object member name","");
      addError(this,(string *)local_f0,&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0048164a;
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0[0].map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&local_c8);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0[0].map_)
    ;
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_00481661;
    }
    readToken(this,&local_88);
    if ((tokenComment < local_88.type_) || ((0x1404U >> (local_88.type_ & 0x1f) & 1) == 0)) {
      local_f0[0].string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)local_f0,&local_88,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0048164a;
    }
    while (local_88.type_ == tokenComment) {
      readToken(this,&local_88);
    }
  } while (local_88.type_ != tokenObjectEnd);
  bVar2 = true;
LAB_00481667:
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool Reader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = JSONCPP_STRING(numberName.asCString());
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}